

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionValue::operator>>
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValueCombination EVar1;
  ExpressionValue *other_local;
  ExpressionValue *this_local;
  ExpressionValue *result;
  
  ExpressionValue(__return_storage_ptr__);
  EVar1 = getValueCombination(this->type,other->type);
  if (EVar1 == II) {
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue =
         (ulong)(this->field_1).intValue >> ((byte)(other->field_1).intValue & 0x3f);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator>>(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = ((uint64_t) intValue) >> other.intValue;
		break;
	default:
		break;
	}

	return result;
}